

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialTangentialDistortion::cleanProperties
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  Properties *pPVar1;
  char *pcVar2;
  Properties *in_RSI;
  allocator local_189;
  string local_188 [32];
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [4];
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  allocator local_59;
  string local_58 [32];
  string local_38 [40];
  Properties *local_10;
  
  local_10 = in_RSI;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_59);
  gutil::Properties::remove(in_RSI,(char *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_58);
  pPVar1 = local_10;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar2,&local_b1);
  gutil::Properties::remove(pPVar1,(char *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_b0);
  pPVar1 = local_10;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar2,&local_f9);
  gutil::Properties::remove(pPVar1,(char *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_f8);
  pPVar1 = local_10;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,pcVar2,&local_141);
  gutil::Properties::remove(pPVar1,(char *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_140);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,pcVar2,&local_189);
  gutil::Properties::remove(local_10,(char *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_188);
  return;
}

Assistant:

void RadialTangentialDistortion::cleanProperties(gutil::Properties &prop, int id) const
{
  prop.remove(getCameraKey("p1", id).c_str());
  prop.remove(getCameraKey("p2", id).c_str());

  prop.remove(getCameraKey("k1", id).c_str());
  prop.remove(getCameraKey("k2", id).c_str());
  prop.remove(getCameraKey("k3", id).c_str());
}